

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_registry.c
# Opt level: O2

int curious_deregister_file(int fd)

{
  undefined8 *puVar1;
  
  puVar1 = (undefined8 *)get_from_curious_dynamic_array(&file_registry,fd);
  free((void *)*puVar1);
  *puVar1 = 0;
  puVar1[1] = 0;
  return 0;
}

Assistant:

int curious_deregister_file(int fd)
{
    curious_file_record_t* cur_record = (curious_file_record_t*) get_from_curious_dynamic_array(&file_registry, fd);

    //printf("deregistering file %s on %s filesystem as %d\n", cur_record->path, cur_record->filesystem, fd);

    free(cur_record->path);
    cur_record->path       = NULL;
    cur_record->filesystem = NULL;

    return 0;
}